

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::SampleShadingRenderCase::iterate(SampleShadingRenderCase *this)

{
  string *psVar1;
  int *piVar2;
  float *pfVar3;
  uint *puVar4;
  ChannelOrder CVar5;
  ChannelType CVar6;
  TestLog *log;
  RenderContext *pRVar7;
  code *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  deUint32 dVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  undefined4 extraout_var;
  TestError *pTVar19;
  char *pcVar20;
  uint i;
  uint uVar21;
  SampleShadingRenderCase *pSVar22;
  TestContext *this_00;
  int iVar23;
  long lVar24;
  allocator<char> local_306;
  allocator<char> local_305;
  int local_304;
  GLint maxSamples;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  float position [8];
  GLuint fbo;
  GLuint rbo;
  string *local_2c8;
  undefined1 local_2c0 [32];
  GLuint fboMs;
  GLuint tex;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  string local_248;
  string local_228;
  string local_208;
  TextureFormat *local_1e8;
  string *local_1e0;
  PixelBufferAccess pixels;
  VertexArrayBinding local_188;
  TextureLevel results;
  deUint32 local_68;
  bool local_40;
  long lVar18;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar13);
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    bVar12 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_sample_shading");
    if (bVar12) goto LAB_00bfa821;
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar20 = "GL_OES_sample_shading";
LAB_00bfb18a:
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_NOT_SUPPORTED,pcVar20);
  }
  else {
LAB_00bfa821:
    if ((this->m_extension)._M_string_length != 0) {
      bVar12 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          (this->m_extension)._M_dataplus._M_p);
      if (!bVar12) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar20 = (this->m_extension)._M_dataplus._M_p;
        goto LAB_00bfb18a;
      }
    }
    this->m_pGLMinSampleShading = *(glMinSampleShadingFunc *)(lVar18 + 0xdc8);
    maxSamples = 0;
    CVar5 = (this->m_texFormat).order;
    CVar6 = (this->m_texFormat).type;
    if ((CVar6 != HALF_FLOAT || CVar5 != RGBA) &&
        ((CVar5 != R && CVar5 != RG) && CVar5 != RGBA || CVar6 != FLOAT)) {
      uVar15 = 0x8d57;
      if (CVar6 == UNSIGNED_INT8) {
        uVar15 = 0x9110;
      }
      if (CVar6 == SIGNED_INT8) {
        uVar15 = 0x9110;
      }
      (**(code **)(lVar18 + 0x868))(uVar15,&maxSamples);
    }
    else {
      (**(code **)(lVar18 + 0x880))(0x9100,this->m_internalFormat,0x80a9,1,&maxSamples);
      if (maxSamples == 0) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar20 = "Multisample is not supported on this format";
        goto LAB_00bfb18a;
      }
    }
    iVar13 = 4;
    if (maxSamples < 4) {
      iVar13 = maxSamples;
    }
    (**(code **)(lVar18 + 0x6f8))(1,&tex);
    (**(code **)(lVar18 + 0xb8))(0x9100,tex);
    local_304 = iVar13;
    (**(code **)(lVar18 + 0x1390))(0x9100,iVar13,this->m_internalFormat,0x10,0x10,0);
    (**(code **)(lVar18 + 0x6d0))(1,&fboMs);
    (**(code **)(lVar18 + 0x78))(0x8d40,fboMs);
    (**(code **)(lVar18 + 0x6a0))(0x8d40,0x8ce0,0x9100,tex,0);
    (**(code **)(lVar18 + 0x1a00))(0,0,0x10,0x10);
    (*this->m_pGLMinSampleShading)(this->m_sampleShading);
    (**(code **)(lVar18 + 0x5e0))(0x8c36);
    pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2c0,
               "${VERSION_DECL}\nin highp vec2 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n   v_color = a_color;\n}\n"
               ,(allocator<char> *)&rbo);
    psVar1 = &this->m_sampler;
    local_2c8 = &this->m_outType;
    specializeVersion((string *)position,(string *)local_2c0,this->m_glslVersion,psVar1,local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,(char *)position._0_8_,(allocator<char> *)&fbo);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,
               "${VERSION_DECL}\nin highp vec4 v_color;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main (void)\n{\n   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n}\n"
               ,&local_305);
    specializeVersion(&local_208,&local_228,this->m_glslVersion,psVar1,local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_208._M_dataplus._M_p,&local_306);
    glu::makeVtxFragSources((ProgramSources *)&pixels,(string *)&result,&local_248);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)&results,pRVar7,(ProgramSources *)&pixels);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&pixels);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)position);
    std::__cxx11::string::~string((string *)local_2c0);
    glu::operator<<(log,(ShaderProgram *)&results);
    if (local_40 == false) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                 ,0x135);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    position[4] = 1.0;
    position[5] = -1.0;
    position[6] = 1.0;
    position[7] = 1.0;
    position[0] = -1.0;
    position[1] = -1.0;
    position[2] = -1.0;
    position[3] = 1.0;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = this->m_min;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)&this->m_min;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ =
         result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start._0_4_;
    (**(code **)(lVar18 + 0x1680))(local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2c0,"a_position",(allocator<char> *)&local_208);
    glu::va::Float((VertexArrayBinding *)&pixels,(string *)local_2c0,2,4,0,position);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"a_color",(allocator<char> *)&local_228);
    glu::va::Float(&local_188,&local_248,4,4,0,(float *)&result);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_2c0);
    local_2c0._0_8_ = &DAT_600000001;
    local_2c0._8_4_ = INDEXTYPE_UINT16;
    local_2c0._16_8_ = iterate::quadIndices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_68,2,
              (VertexArrayBinding *)&pixels,(PrimitiveList *)local_2c0,(DrawUtilCallback *)0x0);
    dVar14 = (**(code **)(lVar18 + 0x800))();
    glu::checkError(dVar14,"Draw quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                    ,0x147);
    local_1e8 = &this->m_texFormat;
    lVar24 = 0x58;
    local_1e0 = psVar1;
    do {
      std::__cxx11::string::~string
                ((string *)((long)pixels.super_ConstPixelBufferAccess.m_size.m_data + lVar24 + -8));
      lVar24 = lVar24 + -0x50;
    } while (lVar24 != -0x48);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&results);
    (*this->m_pGLMinSampleShading)(0.0);
    (**(code **)(lVar18 + 0x4e8))(0x8c36);
    pcVar8 = *(code **)(lVar18 + 0x78);
    iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
    (*pcVar8)(0x8d40,iVar13);
    (**(code **)(lVar18 + 0x440))(1,&fboMs);
    iVar13 = local_304 << 4;
    (**(code **)(lVar18 + 0x6e8))(1,&rbo);
    (**(code **)(lVar18 + 0xa0))(0x8d41,rbo);
    (**(code **)(lVar18 + 0x1238))(0x8d41,this->m_internalFormat,iVar13,0x10);
    (**(code **)(lVar18 + 0x6d0))(1,&fbo);
    (**(code **)(lVar18 + 0x78))(0x8d40,fbo);
    (**(code **)(lVar18 + 0x688))(0x8d40,0x8ce0,0x8d41,rbo);
    (**(code **)(lVar18 + 0x1a00))(0,0,iVar13,0x10);
    pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2c0,
               "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main(void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
               ,&local_305);
    psVar1 = local_1e0;
    specializeVersion((string *)position,(string *)local_2c0,this->m_glslVersion,local_1e0,local_2c8
                     );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,(char *)position._0_8_,&local_306);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,
               "${VERSION_DECL}\nuniform highp ${SAMPLER} u_tex;\nuniform int u_samples;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main(void)\n{\n   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n   int sampleId = int(gl_FragCoord.x) % u_samples;\n   o_color = texelFetch(u_tex, coord, sampleId);\n}\n"
               ,&local_2f9);
    specializeVersion(&local_208,&local_228,this->m_glslVersion,psVar1,local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_208._M_dataplus._M_p,&local_2fa);
    glu::makeVtxFragSources((ProgramSources *)&pixels,(string *)&result,&local_248);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)&results,pRVar7,(ProgramSources *)&pixels);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&pixels);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)position);
    std::__cxx11::string::~string((string *)local_2c0);
    glu::operator<<(log,(ShaderProgram *)&results);
    if (local_40 == false) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                 ,0x175);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xbf8000003f800000;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = -1.0;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = -1.0;
    result.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f800000bf800000;
    (**(code **)(lVar18 + 0x1680))(local_68);
    pcVar8 = *(code **)(lVar18 + 0x14f0);
    uVar15 = (**(code **)(lVar18 + 0xb48))(local_68,"u_samples");
    (*pcVar8)(uVar15,local_304);
    pcVar8 = *(code **)(lVar18 + 0x14f0);
    uVar15 = (**(code **)(lVar18 + 0xb48))(local_68,"u_tex");
    (*pcVar8)(uVar15,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)position,"a_position",(allocator<char> *)local_2c0);
    glu::va::Float((VertexArrayBinding *)&pixels,(string *)position,2,4,0,(float *)&result);
    std::__cxx11::string::~string((string *)position);
    position._0_8_ = &DAT_600000001;
    position[2] = 1.4013e-45;
    position._16_8_ = iterate::quadIndices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_68,1,
              (VertexArrayBinding *)&pixels,(PrimitiveList *)position,(DrawUtilCallback *)0x0);
    dVar14 = (**(code **)(lVar18 + 0x800))();
    glu::checkError(dVar14,"Draw quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                    ,0x186);
    std::__cxx11::string::~string((string *)&pixels.super_ConstPixelBufferAccess.m_size);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&results);
    tcu::TextureLevel::TextureLevel(&results,local_1e8,iVar13,0x10,1);
    tcu::TextureLevel::getAccess(&pixels,&results);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&result,(long)(pixels.super_ConstPixelBufferAccess.m_size.m_data[0] *
                             pixels.super_ConstPixelBufferAccess.m_size.m_data[1]),
               (allocator_type *)position);
    if (pixels.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT8) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)position,
                 (long)(pixels.super_ConstPixelBufferAccess.m_size.m_data[1] *
                        pixels.super_ConstPixelBufferAccess.m_size.m_data[0] * 4),
                 (allocator_type *)local_2c0);
      uVar21 = 0;
      pSVar22 = (SampleShadingRenderCase *)0x0;
      (**(code **)(lVar18 + 0x1220))
                (0,0,pixels.super_ConstPixelBufferAccess.m_size.m_data[0],
                 pixels.super_ConstPixelBufferAccess.m_size.m_data[1],0x8d99,0x1405,position._0_8_);
      while( true ) {
        if ((ulong)((long)(position._8_8_ - position._0_8_) >> 2) <= (ulong)uVar21) break;
        puVar4 = (uint *)(position._0_8_ + (ulong)uVar21 * 4);
        uVar9 = puVar4[1];
        uVar10 = puVar4[2];
        uVar11 = puVar4[3];
        pfVar3 = (float *)(CONCAT44(result.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    result.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                          (ulong)(uVar21 >> 2) * 0x10);
        *pfVar3 = ((float)(*puVar4 >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(*puVar4 & 0xffff | 0x4b000000);
        pfVar3[1] = ((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar9 & 0xffff | 0x4b000000);
        pfVar3[2] = ((float)(uVar10 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar10 & 0xffff | 0x4b000000);
        pfVar3[3] = ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar11 & 0xffff | 0x4b000000);
        uVar21 = uVar21 + 4;
      }
      iVar13 = countUniquePixels(pSVar22,&result);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)position);
    }
    else if (pixels.super_ConstPixelBufferAccess.m_format.type == SIGNED_INT8) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)position,
                 (long)(pixels.super_ConstPixelBufferAccess.m_size.m_data[1] *
                        pixels.super_ConstPixelBufferAccess.m_size.m_data[0] * 4),
                 (allocator_type *)local_2c0);
      uVar21 = 0;
      pSVar22 = (SampleShadingRenderCase *)0x0;
      (**(code **)(lVar18 + 0x1220))
                (0,0,pixels.super_ConstPixelBufferAccess.m_size.m_data[0],
                 pixels.super_ConstPixelBufferAccess.m_size.m_data[1],0x8d99,0x1404,position._0_8_);
      while( true ) {
        if ((ulong)((long)(position._8_8_ - position._0_8_) >> 2) <= (ulong)uVar21) break;
        piVar2 = (int *)(position._0_8_ + (ulong)uVar21 * 4);
        iVar13 = piVar2[1];
        iVar17 = piVar2[2];
        iVar16 = piVar2[3];
        pfVar3 = (float *)(CONCAT44(result.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    result.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                          (ulong)(uVar21 >> 2) * 0x10);
        *pfVar3 = (float)*piVar2;
        pfVar3[1] = (float)iVar13;
        pfVar3[2] = (float)iVar17;
        pfVar3[3] = (float)iVar16;
        uVar21 = uVar21 + 4;
      }
      iVar13 = countUniquePixels(pSVar22,&result);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)position);
    }
    else {
      pSVar22 = (SampleShadingRenderCase *)((this->super_TestCase).m_context)->m_renderCtx;
      glu::readPixels((RenderContext *)pSVar22,0,0,&pixels);
      iVar13 = countUniquePixels(pSVar22,&pixels.super_ConstPixelBufferAccess);
    }
    iVar16 = (int)((float)local_304 * this->m_sampleShading);
    iVar17 = local_304;
    if (iVar16 < local_304) {
      iVar17 = iVar16;
    }
    iVar23 = 0x100;
    if (0 < iVar16) {
      iVar23 = iVar17 << 8;
    }
    pcVar8 = *(code **)(lVar18 + 0x78);
    iVar17 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
    (*pcVar8)(0x8d40,iVar17);
    (**(code **)(lVar18 + 0x440))(1,&fbo);
    (**(code **)(lVar18 + 0xa0))(0x8d41,0);
    (**(code **)(lVar18 + 0x460))(1,&rbo);
    (**(code **)(lVar18 + 0xb8))(0x9100,0);
    (**(code **)(lVar18 + 0x480))(1,&tex);
    pcVar20 = "Pass";
    if (iVar13 < iVar23) {
      pcVar20 = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(iVar13 < iVar23),pcVar20);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&result.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    tcu::TextureLevel::~TextureLevel(&results);
  }
  return STOP;
}

Assistant:

SampleShadingRenderCase::IterateResult SampleShadingRenderCase::iterate()
{
	TestLog&			  log  = m_testCtx.getLog();
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_shading");
		return STOP;
	}
	if (!m_extension.empty() && !m_context.getContextInfo().isExtensionSupported(m_extension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, m_extension.c_str());
		return STOP;
	}

	m_pGLMinSampleShading = gl.minSampleShading;

	GLint maxSamples = 0;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (maxSamples == 0)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Multisample is not supported on this format");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
	}
	GLint samples = de::min<GLint>(maxSamples, MAX_SAMPLES);

	GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, tex);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);

	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);

	m_pGLMinSampleShading(m_sampleShading);
	gl.enable(GL_SAMPLE_SHADING_OES);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "in highp vec4 a_color;\n"
								 "out highp vec4 v_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "   v_color = a_color;\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "in highp vec4 v_color;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		const float position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};
		const float color[] = {
			m_min, m_min, 0.0f, 1.0f, m_min, m_max, 0.0f, 1.0f, m_max, m_min, 0.0f, 1.0f, m_max, m_max, 0.0f, 1.0f,
		};

		gl.useProgram(program.getProgram());

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]), glu::va::Float("a_color", 4, 4, 0, &color[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}
	m_pGLMinSampleShading(0.0f);
	gl.disable(GL_SAMPLE_SHADING_OES);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * samples;

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "   int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "   o_color = texelFetch(u_tex, coord, sampleId);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), samples);
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());
	int					   uniquePixels;

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
		uniquePixels = countUniquePixels(pixels);
	}
	int expectedUnique = WIDTH * HEIGHT * (de::clamp(int(float(samples) * m_sampleShading), 1, samples));
	if (uniquePixels < expectedUnique)
	{
		isOk = false;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}